

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O0

void print_input_usage(void)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  void *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> f;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostream *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --in-format       the format of the input file. Defaults to \"flagser\". Available options are:"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_8 = &available_input_formats_abi_cxx11_;
  local_10._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffffa8);
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_10);
    std::__cxx11::string::string(local_38,(string *)pbVar3);
    in_stack_ffffffffffffffb0 = std::operator<<((ostream *)&std::cerr,"                         ");
    in_stack_ffffffffffffffa8 = std::operator<<(in_stack_ffffffffffffffb0,local_38);
    std::ostream::operator<<(in_stack_ffffffffffffffa8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_10);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --h5-type type     the type of data in the h5-file. The type can either be \"matrix\""
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     if at the given path in the HDF5-file there is the connectivity matrix or"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     \"grouped\" if the connectivity matrices are grouped. To only"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     consider a subset of the groups you can list them after"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     \"grouped\", e.g. \"grouped:L1_DAC,L2*\". The star is a placeholder"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     for arbitrary characters. The type defaults to \"matrix\" and is"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"                     only relevant for the input type h5.");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," [HDF5 library not found]");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  --undirected       compute the *undirected* flag complex");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "  --components       compute the directed flag complex for each individual connected"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     component of the input graph. Warning: this currently only works"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     for the trivial filtration. Additionally, isolated vertices are"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"                     ignored.");
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_input_usage() {
	std::cerr << "  --in-format       the format of the input file. Defaults to \"flagser\". Available options are:"
	          << std::endl;

	for (auto f : available_input_formats) std::cerr << "                         " << f << std::endl;

	std::cerr << "  --h5-type type     the type of data in the h5-file. The type can either be \"matrix\"" << std::endl
	          << "                     if at the given path in the HDF5-file there is the connectivity matrix or"
	          << std::endl
	          << "                     \"grouped\" if the connectivity matrices are grouped. To only" << std::endl
	          << "                     consider a subset of the groups you can list them after" << std::endl
	          << "                     \"grouped\", e.g. \"grouped:L1_DAC,L2*\". The star is a placeholder" << std::endl
	          << "                     for arbitrary characters. The type defaults to \"matrix\" and is" << std::endl
	          << "                     only relevant for the input type h5." << std::endl
#ifndef WITH_HDF5
	          << " [HDF5 library not found]" << std::endl
#endif
	          << "  --undirected       compute the *undirected* flag complex" << std::endl
	          << "  --components       compute the directed flag complex for each individual connected" << std::endl
	          << "                     component of the input graph. Warning: this currently only works" << std::endl
	          << "                     for the trivial filtration. Additionally, isolated vertices are" << std::endl
	          << "                     ignored." << std::endl
	          << std::endl;
}